

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O3

void start_pass(j_decompress_ptr cinfo)

{
  undefined4 *puVar1;
  double dVar2;
  jpeg_inverse_dct *pjVar3;
  JQUANT_TBL *pJVar4;
  void *pvVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  uint6 uVar10;
  uint uVar11;
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  unkbyte10 Var14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  inverse_DCT_method_ptr p_Var17;
  code *pcVar18;
  jpeg_error_mgr *pjVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  jpeg_component_info *pjVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong uVar33;
  uint uVar39;
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  uint uVar40;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined2 uVar38;
  
  if (0 < cinfo->num_components) {
    pjVar30 = cinfo->comp_info;
    pjVar3 = cinfo->idct;
    lVar29 = 0;
    p_Var17 = (inverse_DCT_method_ptr)0x0;
    uVar21 = 0;
    do {
      iVar20 = pjVar30->DCT_h_scaled_size;
      iVar24 = iVar20 * 0x100 + pjVar30->DCT_v_scaled_size;
      if (iVar24 < 0x70e) {
        if (0x403 < iVar24) {
          if (iVar24 < 0x603) {
            if (iVar24 < 0x505) {
              if (iVar24 == 0x404) {
                pcVar18 = jpeg_idct_4x4;
              }
              else {
                if (iVar24 != 0x408) goto LAB_0027f17d;
                pcVar18 = jpeg_idct_4x8;
              }
            }
            else if (iVar24 == 0x505) {
              pcVar18 = jpeg_idct_5x5;
            }
            else {
              if (iVar24 != 0x50a) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_5x10;
            }
          }
          else if (iVar24 < 0x60c) {
            if (iVar24 == 0x603) {
              pcVar18 = jpeg_idct_6x3;
            }
            else {
              if (iVar24 != 0x606) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_6x6;
            }
          }
          else if (iVar24 == 0x60c) {
            pcVar18 = jpeg_idct_6x12;
          }
          else {
            if (iVar24 != 0x707) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_7x7;
          }
          goto LAB_0027f005;
        }
        if (0x203 < iVar24) {
          if (iVar24 < 0x306) {
            if (iVar24 == 0x204) {
              pcVar18 = jpeg_idct_2x4;
            }
            else {
              if (iVar24 != 0x303) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_3x3;
            }
          }
          else if (iVar24 == 0x306) {
            pcVar18 = jpeg_idct_3x6;
          }
          else {
            if (iVar24 != 0x402) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_4x2;
          }
          goto LAB_0027f005;
        }
        if (0x200 < iVar24) {
          if (iVar24 == 0x201) {
            pcVar18 = jpeg_idct_2x1;
          }
          else {
            if (iVar24 != 0x202) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_2x2;
          }
          goto LAB_0027f005;
        }
        pcVar18 = jpeg_idct_1x1;
        uVar22 = 0;
        if (iVar24 != 0x101) {
          if (iVar24 != 0x102) {
LAB_0027f17d:
            pjVar19 = cinfo->err;
            pjVar19->msg_code = 7;
            (pjVar19->msg_parm).i[0] = iVar20;
            (cinfo->err->msg_parm).i[1] = pjVar30->DCT_v_scaled_size;
            pjVar19 = cinfo->err;
            goto LAB_0027f1a8;
          }
          pcVar18 = jpeg_idct_1x2;
          goto LAB_0027f005;
        }
      }
      else {
        if (iVar24 < 0xc06) {
          if (iVar24 < 0x909) {
            if (iVar24 < 0x808) {
              if (iVar24 == 0x70e) {
                pcVar18 = jpeg_idct_7x14;
              }
              else {
                if (iVar24 != 0x804) goto LAB_0027f17d;
                pcVar18 = jpeg_idct_8x4;
              }
            }
            else {
              if (iVar24 == 0x808) {
                uVar22 = (ulong)cinfo->dct_method;
                if (uVar22 < 3) {
                  pcVar18 = (code *)(&PTR_jpeg_idct_islow_003b04e0)[uVar22];
                  goto LAB_0027f007;
                }
                pjVar19 = cinfo->err;
                pjVar19->msg_code = 0x31;
LAB_0027f1a8:
                (*pjVar19->error_exit)((j_common_ptr)cinfo);
                pcVar18 = p_Var17;
                uVar22 = uVar21;
                goto LAB_0027f007;
              }
              if (iVar24 != 0x810) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_8x16;
            }
          }
          else if (iVar24 < 0xa0a) {
            if (iVar24 == 0x909) {
              pcVar18 = jpeg_idct_9x9;
            }
            else {
              if (iVar24 != 0xa05) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_10x5;
            }
          }
          else if (iVar24 == 0xa0a) {
            pcVar18 = jpeg_idct_10x10;
          }
          else {
            if (iVar24 != 0xb0b) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_11x11;
          }
        }
        else if (iVar24 < 0xe0e) {
          if (iVar24 < 0xd0d) {
            if (iVar24 == 0xc06) {
              pcVar18 = jpeg_idct_12x6;
            }
            else {
              if (iVar24 != 0xc0c) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_12x12;
            }
          }
          else if (iVar24 == 0xd0d) {
            pcVar18 = jpeg_idct_13x13;
          }
          else {
            if (iVar24 != 0xe07) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_14x7;
          }
        }
        else if (iVar24 < 0x1008) {
          if (iVar24 == 0xe0e) {
            pcVar18 = jpeg_idct_14x14;
          }
          else {
            if (iVar24 != 0xf0f) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_15x15;
          }
        }
        else if (iVar24 == 0x1008) {
          pcVar18 = jpeg_idct_16x8;
        }
        else {
          if (iVar24 != 0x1010) goto LAB_0027f17d;
          pcVar18 = jpeg_idct_16x16;
        }
LAB_0027f005:
        uVar22 = 0;
      }
LAB_0027f007:
      pjVar3->inverse_DCT[lVar29] = pcVar18;
      if (((pjVar30->component_needed != 0) &&
          (iVar20 = (int)uVar22, *(int *)((long)pjVar3[1].inverse_DCT + lVar29 * 4 + -8) != iVar20))
         && (pJVar4 = pjVar30->quant_table, pJVar4 != (JQUANT_TBL *)0x0)) {
        *(int *)((long)pjVar3[1].inverse_DCT + lVar29 * 4 + -8) = iVar20;
        pvVar5 = pjVar30->dct_table;
        lVar25 = 0;
        if (iVar20 == 0) {
          do {
            uVar21 = *(ulong *)(pJVar4->quantval + lVar25);
            auVar7._8_4_ = 0;
            auVar7._0_8_ = uVar21;
            auVar7._12_2_ = (short)(uVar21 >> 0x30);
            auVar9._8_2_ = (short)(uVar21 >> 0x20);
            auVar9._0_8_ = uVar21;
            auVar9._10_4_ = auVar7._10_4_;
            auVar16._6_8_ = 0;
            auVar16._0_6_ = auVar9._8_6_;
            auVar32._6_8_ = SUB148(auVar16 << 0x40,6);
            auVar32._4_2_ = (short)(uVar21 >> 0x10);
            auVar32._0_2_ = (ushort)uVar21;
            auVar32._2_2_ = 0;
            auVar32._14_2_ = 0;
            *(undefined1 (*) [16])((long)pvVar5 + lVar25 * 4) = auVar32;
            lVar25 = lVar25 + 4;
          } while (lVar25 != 0x40);
        }
        else if (iVar20 == 1) {
          do {
            uVar21 = *(ulong *)((long)pJVar4->quantval + lVar25);
            auVar6._8_4_ = 0;
            auVar6._0_8_ = uVar21;
            auVar6._12_2_ = (short)(uVar21 >> 0x30);
            auVar8._8_2_ = (short)(uVar21 >> 0x20);
            auVar8._0_8_ = uVar21;
            auVar8._10_4_ = auVar6._10_4_;
            uVar10 = auVar8._8_6_;
            auVar13._6_8_ = 0;
            auVar13._0_6_ = uVar10;
            Var14 = CONCAT82(SUB148(auVar13 << 0x40,6),(short)(uVar21 >> 0x10));
            auVar12._2_2_ = 0;
            auVar12._0_2_ = (ushort)uVar21;
            auVar12._4_10_ = Var14;
            uVar33 = (ulong)(uint)Var14;
            uVar11 = auVar6._10_4_ >> 0x10;
            uVar21 = *(ulong *)((long)start_pass::aanscales + lVar25);
            uVar38 = (undefined2)(uVar21 >> 0x30);
            auVar36._8_4_ = 0;
            auVar36._0_8_ = uVar21;
            auVar36._12_2_ = uVar38;
            auVar36._14_2_ = uVar38;
            uVar38 = (undefined2)(uVar21 >> 0x20);
            auVar35._12_4_ = auVar36._12_4_;
            auVar35._8_2_ = 0;
            auVar35._0_8_ = uVar21;
            auVar35._10_2_ = uVar38;
            auVar34._10_6_ = auVar35._10_6_;
            auVar34._8_2_ = uVar38;
            auVar34._0_8_ = uVar21;
            uVar38 = (undefined2)(uVar21 >> 0x10);
            auVar15._4_8_ = auVar34._8_8_;
            auVar15._2_2_ = uVar38;
            auVar15._0_2_ = uVar38;
            auVar37._4_4_ = auVar15._0_4_ >> 0x10;
            uVar39 = auVar34._8_4_ >> 0x10;
            auVar37._12_4_ = auVar35._12_4_ >> 0x10;
            uVar40 = -(uint)((short)uVar21 < 0);
            auVar37._0_4_ = uVar39;
            auVar37._8_4_ = auVar37._12_4_;
            auVar31._4_4_ = -(uint)((int)auVar37._4_4_ < 0);
            auVar31._0_4_ = uVar40;
            auVar31._8_4_ = -(uint)((int)auVar37._4_4_ < 0);
            auVar31._12_4_ = -(uint)(auVar37._12_4_ < 0);
            puVar1 = (undefined4 *)((long)pvVar5 + lVar25 * 2);
            *puVar1 = (int)((ulong)(uint)(int)(short)uVar21 * (auVar12._0_8_ & 0xffffffff) + 0x800 +
                            ((ulong)uVar40 * (auVar12._0_8_ & 0xffffffff) << 0x20) >> 0xc);
            puVar1[1] = (int)(auVar37._4_4_ * uVar33 + 0x800 +
                              ((auVar31._8_8_ & 0xffffffff) * uVar33 << 0x20) >> 0xc);
            puVar1[2] = (int)((ulong)uVar39 * ((ulong)uVar10 & 0xffffffff) + 0x800 +
                              ((ulong)-(uint)((int)uVar39 < 0) * ((ulong)uVar10 & 0xffffffff) <<
                              0x20) >> 0xc);
            puVar1[3] = (int)((auVar37._8_8_ & 0xffffffff) * (ulong)uVar11 + 0x800 +
                              ((ulong)-(uint)(auVar37._12_4_ < 0) * (ulong)uVar11 << 0x20) >> 0xc);
            lVar25 = lVar25 + 8;
          } while (lVar25 != 0x80);
        }
        else {
          lVar26 = 0;
          do {
            lVar27 = (long)(int)lVar26;
            lVar26 = lVar27 + 8;
            dVar2 = start_pass::aanscalefactor[lVar25];
            pdVar28 = start_pass::aanscalefactor;
            lVar23 = 0;
            do {
              *(ulong *)((long)pvVar5 + lVar23 * 4 + lVar27 * 4) =
                   CONCAT44((float)((double)(*(uint *)(pJVar4->quantval + lVar27 + lVar23) >> 0x10)
                                    * dVar2 * pdVar28[1] * 0.125),
                            (float)((double)(*(uint *)(pJVar4->quantval + lVar27 + lVar23) & 0xffff)
                                    * dVar2 * *pdVar28 * 0.125));
              lVar23 = lVar23 + 2;
              pdVar28 = pdVar28 + 2;
            } while (lVar23 != 8);
            lVar25 = lVar25 + 1;
          } while (lVar25 != 8);
        }
      }
      lVar29 = lVar29 + 1;
      pjVar30 = pjVar30 + 1;
      p_Var17 = pcVar18;
      uVar21 = uVar22;
    } while (lVar29 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  my_idct_ptr idct = (my_idct_ptr) cinfo->idct;
  int ci, i;
  jpeg_component_info *compptr;
  int method = 0;
  inverse_DCT_method_ptr method_ptr = NULL;
  JQUANT_TBL * qtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper IDCT routine for this component's scaling */
    switch ((compptr->DCT_h_scaled_size << 8) + compptr->DCT_v_scaled_size) {
#ifdef IDCT_SCALING_SUPPORTED
    case ((1 << 8) + 1):
      method_ptr = jpeg_idct_1x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 2):
      method_ptr = jpeg_idct_2x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 3):
      method_ptr = jpeg_idct_3x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 4):
      method_ptr = jpeg_idct_4x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 5):
      method_ptr = jpeg_idct_5x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 6):
      method_ptr = jpeg_idct_6x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 7):
      method_ptr = jpeg_idct_7x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((9 << 8) + 9):
      method_ptr = jpeg_idct_9x9;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 10):
      method_ptr = jpeg_idct_10x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((11 << 8) + 11):
      method_ptr = jpeg_idct_11x11;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 12):
      method_ptr = jpeg_idct_12x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((13 << 8) + 13):
      method_ptr = jpeg_idct_13x13;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 14):
      method_ptr = jpeg_idct_14x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((15 << 8) + 15):
      method_ptr = jpeg_idct_15x15;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 16):
      method_ptr = jpeg_idct_16x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 8):
      method_ptr = jpeg_idct_16x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 7):
      method_ptr = jpeg_idct_14x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 6):
      method_ptr = jpeg_idct_12x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 5):
      method_ptr = jpeg_idct_10x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 4):
      method_ptr = jpeg_idct_8x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 3):
      method_ptr = jpeg_idct_6x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 2):
      method_ptr = jpeg_idct_4x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 1):
      method_ptr = jpeg_idct_2x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 16):
      method_ptr = jpeg_idct_8x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 14):
      method_ptr = jpeg_idct_7x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 12):
      method_ptr = jpeg_idct_6x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 10):
      method_ptr = jpeg_idct_5x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 8):
      method_ptr = jpeg_idct_4x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 6):
      method_ptr = jpeg_idct_3x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 4):
      method_ptr = jpeg_idct_2x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((1 << 8) + 2):
      method_ptr = jpeg_idct_1x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
#endif
    case ((DCTSIZE << 8) + DCTSIZE):
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
	method_ptr = jpeg_idct_islow;
	method = JDCT_ISLOW;
	break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
	method_ptr = jpeg_idct_ifast;
	method = JDCT_IFAST;
	break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
	method_ptr = jpeg_idct_float;
	method = JDCT_FLOAT;
	break;
#endif
      default:
	ERREXIT(cinfo, JERR_NOT_COMPILED);
	break;
      }
      break;
    default:
      ERREXIT2(cinfo, JERR_BAD_DCTSIZE,
	       compptr->DCT_h_scaled_size, compptr->DCT_v_scaled_size);
      break;
    }
    idct->pub.inverse_DCT[ci] = method_ptr;
    /* Create multiplier table from quant table.
     * However, we can skip this if the component is uninteresting
     * or if we already built the table.  Also, if no quant table
     * has yet been saved for the component, we leave the
     * multiplier table all-zero; we'll be reading zeroes from the
     * coefficient controller's buffer anyway.
     */
    if (! compptr->component_needed || idct->cur_method[ci] == method)
      continue;
    qtbl = compptr->quant_table;
    if (qtbl == NULL)		/* happens if no data yet for component */
      continue;
    idct->cur_method[ci] = method;
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      {
	/* For LL&M IDCT method, multipliers are equal to raw quantization
	 * coefficients, but are stored as ints to ensure access efficiency.
	 */
	ISLOW_MULT_TYPE * ismtbl = (ISLOW_MULT_TYPE *) compptr->dct_table;
	for (i = 0; i < DCTSIZE2; i++) {
	  ismtbl[i] = (ISLOW_MULT_TYPE) qtbl->quantval[i];
	}
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
	/* For AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * For integer operation, the multiplier table is to be scaled by
	 * IFAST_SCALE_BITS.
	 */
	IFAST_MULT_TYPE * ifmtbl = (IFAST_MULT_TYPE *) compptr->dct_table;
#define CONST_BITS 14
	static const INT16 aanscales[DCTSIZE2] = {
	  /* precomputed values scaled up by 14 bits */
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
	  21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
	  19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
	   8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
	   4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
	};
	SHIFT_TEMPS

	for (i = 0; i < DCTSIZE2; i++) {
	  ifmtbl[i] = (IFAST_MULT_TYPE)
	    DESCALE(MULTIPLY16V16((INT32) qtbl->quantval[i],
				  (INT32) aanscales[i]),
		    CONST_BITS-IFAST_SCALE_BITS);
	}
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
	/* For float AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 1/8.
	 */
	FLOAT_MULT_TYPE * fmtbl = (FLOAT_MULT_TYPE *) compptr->dct_table;
	int row, col;
	static const double aanscalefactor[DCTSIZE] = {
	  1.0, 1.387039845, 1.306562965, 1.175875602,
	  1.0, 0.785694958, 0.541196100, 0.275899379
	};

	i = 0;
	for (row = 0; row < DCTSIZE; row++) {
	  for (col = 0; col < DCTSIZE; col++) {
	    fmtbl[i] = (FLOAT_MULT_TYPE)
	      ((double) qtbl->quantval[i] *
	       aanscalefactor[row] * aanscalefactor[col] * 0.125);
	    i++;
	  }
	}
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}